

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::MetaZoneIDsEnumeration::snext(MetaZoneIDsEnumeration *this,UErrorCode *status)

{
  int index;
  UBool UVar1;
  char16_t *srcChars;
  UErrorCode *status_local;
  MetaZoneIDsEnumeration *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  if (((UVar1 == '\0') || (this->fMetaZoneIDs == (UVector *)0x0)) ||
     (*(int *)&(this->super_StringEnumeration).field_0x74 <= this->fPos)) {
    this_local = (MetaZoneIDsEnumeration *)0x0;
  }
  else {
    index = this->fPos;
    this->fPos = index + 1;
    srcChars = (char16_t *)UVector::elementAt(this->fMetaZoneIDs,index);
    icu_63::UnicodeString::setTo(&(this->super_StringEnumeration).unistr,srcChars,-1);
    this_local = (MetaZoneIDsEnumeration *)&(this->super_StringEnumeration).unistr;
  }
  return (UnicodeString *)this_local;
}

Assistant:

const UnicodeString*
MetaZoneIDsEnumeration::snext(UErrorCode& status) {
    if (U_SUCCESS(status) && fMetaZoneIDs != NULL && fPos < fLen) {
        unistr.setTo((const UChar*)fMetaZoneIDs->elementAt(fPos++), -1);
        return &unistr;
    }
    return NULL;
}